

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O3

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::chop
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t delta)

{
  ulong uVar1;
  BufHdr *pBVar2;
  bool bVar3;
  size_t length;
  
  uVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  length = uVar1 - delta;
  if (uVar1 < delta || length == 0) {
    pBVar2 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
    if (pBVar2 != (BufHdr *)0x0) {
      if ((pBVar2->super_RefCount).m_refCount == 1) {
        (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p = (C *)(pBVar2 + 1)
        ;
        *(undefined1 *)&pBVar2[1].super_RefCount._vptr_RefCount = 0;
        (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
      }
      else {
        StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                  (&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      }
    }
  }
  else {
    bVar3 = overrideLength(this,length);
    if (!bVar3) {
      return 0xffffffffffffffff;
    }
  }
  return (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
}

Assistant:

size_t
	chop(size_t delta) {
		if (this->m_length <= delta) {
			clear();
		} else {
			bool result = overrideLength(this->m_length - delta);
			if (!result)
				return -1;
		}

		return this->m_length;
	}